

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O1

UChar32 utf8IteratorNext(UCharIterator *iter)

{
  long lVar1;
  byte bVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  long lVar9;
  int iVar10;
  
  if (iter->reservedField != 0) {
    uVar4 = iter->reservedField & 0x3ffU | 0xdc00;
    iter->reservedField = 0;
    if (iter->index < 0) {
      return uVar4;
    }
    iter->index = iter->index + 1;
    return uVar4;
  }
  lVar9 = (long)iter->start;
  iVar5 = iter->limit;
  if (iVar5 <= iter->start) {
    return -1;
  }
  pvVar3 = iter->context;
  lVar1 = lVar9 + 1;
  iter->start = (int)lVar1;
  bVar2 = *(byte *)((long)pvVar3 + lVar9);
  uVar7 = (uint)bVar2;
  uVar4 = uVar7;
  if ((-1 < (char)bVar2) || (uVar4 = 0xfffd, (int)lVar1 == iVar5)) goto LAB_00356146;
  if (bVar2 < 0xe0) {
    if (bVar2 < 0xc2) goto LAB_00356146;
    uVar7 = uVar7 & 0x1f;
  }
  else {
    if (bVar2 < 0xf0) {
      uVar7 = uVar7 & 0xf;
      if (((byte)" 000000000000\x1000"[uVar7] >> (*(byte *)((long)pvVar3 + lVar1) >> 5) & 1) == 0)
      goto LAB_00356146;
      bVar8 = *(byte *)((long)pvVar3 + lVar1) & 0x3f;
    }
    else {
      if (0xf4 < bVar2) goto LAB_00356146;
      bVar2 = *(byte *)((long)pvVar3 + lVar1);
      if (((uint)(int)""[bVar2 >> 4] >> (uVar7 - 0xf0 & 0x1f) & 1) == 0) goto LAB_00356146;
      iVar10 = (int)(lVar9 + 2);
      iter->start = iVar10;
      if ((iVar10 == iVar5) || (bVar8 = *(char *)((long)pvVar3 + lVar9 + 2) + 0x80, 0x3f < bVar8))
      goto LAB_00356146;
      uVar7 = bVar2 & 0x3f | (uVar7 - 0xf0) * 0x40;
    }
    iVar10 = iter->start + 1;
    iter->start = iVar10;
    if (iVar10 == iVar5) goto LAB_00356146;
    uVar7 = (uint)bVar8 | uVar7 << 6;
  }
  uVar6 = *(byte *)((long)pvVar3 + (long)iter->start) ^ 0x80;
  if ((byte)uVar6 < 0x40) {
    iter->start = iter->start + 1;
    uVar4 = uVar7 << 6 | uVar6;
  }
LAB_00356146:
  iVar10 = iter->index;
  if (iVar10 < 0) {
    if ((iter->start == iVar5) && (-1 < iter->length)) {
      iter->index = iter->length - (uint)(0xffff < (int)uVar4);
    }
  }
  else {
    iter->index = iVar10 + 1;
    if ((iter->length < 0) && (iter->start == iVar5)) {
      iVar5 = iVar10 + 2;
      if ((int)uVar4 < 0x10000) {
        iVar5 = iVar10 + 1;
      }
      iter->length = iVar5;
    }
  }
  if ((int)uVar4 < 0x10000) {
    return uVar4;
  }
  iter->reservedField = uVar4;
  return (uVar4 >> 10) + 0xd7c0 & 0xffff;
}

Assistant:

static UChar32 U_CALLCONV
utf8IteratorNext(UCharIterator *iter) {
    int32_t index;

    if(iter->reservedField!=0) {
        UChar trail=U16_TRAIL(iter->reservedField);
        iter->reservedField=0;
        if((index=iter->index)>=0) {
            iter->index=index+1;
        }
        return trail;
    } else if(iter->start<iter->limit) {
        const uint8_t *s=(const uint8_t *)iter->context;
        UChar32 c;

        U8_NEXT_OR_FFFD(s, iter->start, iter->limit, c);
        if((index=iter->index)>=0) {
            iter->index=++index;
            if(iter->length<0 && iter->start==iter->limit) {
                iter->length= c<=0xffff ? index : index+1;
            }
        } else if(iter->start==iter->limit && iter->length>=0) {
            iter->index= c<=0xffff ? iter->length : iter->length-1;
        }
        if(c<=0xffff) {
            return c;
        } else {
            iter->reservedField=c;
            return U16_LEAD(c);
        }
    } else {
        return U_SENTINEL;
    }
}